

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_allocator.h
# Opt level: O0

void __thiscall
iffl::debug_memory_resource::do_deallocate
          (debug_memory_resource *this,void *p,size_t bytes,size_t alignment)

{
  ulong *__ptr;
  long *plVar1;
  suffix_t *suffix;
  size_t user_allocation_size;
  prefix_t *prefix;
  size_t alignment_local;
  size_t bytes_local;
  void *p_local;
  debug_memory_resource *this_local;
  
  decrement_busy_block_count(this);
  __ptr = (ulong *)((long)p + -0x20);
  if (*(long *)((long)p + -8) != 0xbeefabcd) {
    std::terminate();
  }
  if (*(debug_memory_resource **)((long)p + -0x10) != this) {
    std::terminate();
  }
  if (*__ptr < 0x29) {
    std::terminate();
  }
  if (*__ptr - 0x28 == bytes) {
    if (*(size_t *)((long)p + -0x18) != alignment) {
      std::terminate();
    }
    plVar1 = (long *)((long)__ptr + (*__ptr - 8));
    if (*plVar1 == 0xdeadabcd) {
      *(undefined8 *)((long)p + -0x10) = 0;
      *(undefined8 *)((long)p + -8) = 0xbeefabce;
      *plVar1 = 0xdeadabce;
      free(__ptr);
      return;
    }
    std::terminate();
  }
  std::terminate();
}

Assistant:

void do_deallocate(void* p, size_t bytes, [[maybe_unused]] size_t alignment) noexcept override {

        decrement_busy_block_count();

        prefix_t *prefix{ static_cast<prefix_t *>(p) - 1 };
        FFL_CODDING_ERROR_IF_NOT(prefix->pattern == busy_block_prefix_pattern);
        FFL_CODDING_ERROR_IF_NOT(prefix->memory_resource == this);
        FFL_CODDING_ERROR_IF_NOT(prefix->size > min_allocation_size);
        size_t const user_allocation_size = prefix->size - min_allocation_size;
        FFL_CODDING_ERROR_IF_NOT(user_allocation_size == bytes);
        FFL_CODDING_ERROR_IF_NOT(prefix->alignment == alignment);
        suffix_t *suffix{ reinterpret_cast<suffix_t *>(reinterpret_cast<char *>(prefix) + prefix->size) - 1 };
        FFL_CODDING_ERROR_IF_NOT(suffix->pattern == busy_block_suffix_pattern);

        prefix->memory_resource = nullptr;
        prefix->pattern = free_block_prefix_pattern;
        suffix->pattern = free_block_suffix_pattern;

        FFL_ALLIGNED_FREE(prefix);
    }